

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

Float __thiscall
pbrt::PortalImageInfiniteLight::PDF_Li
          (PortalImageInfiniteLight *this,LightSampleContext ctx,Vector3f w,LightSamplingMode mode)

{
  undefined1 auVar1 [16];
  Float FVar2;
  float fVar3;
  undefined1 auVar4 [16];
  Float duv_dw;
  float local_44;
  undefined1 local_40 [28];
  char local_24;
  Tuple3<pbrt::Point3,_float> local_20;
  
  ImageFromRender((PortalImageInfiniteLight *)local_40,w,(Float *)this);
  fVar3 = 0.0;
  if ((local_40[8] == '\x01') && ((local_44 != 0.0 || (NAN(local_44))))) {
    auVar1 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                           ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    auVar4._0_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                   high + auVar1._0_4_;
    auVar4._4_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                   low + auVar1._4_4_;
    auVar4._8_4_ = auVar1._8_4_ + 0.0;
    auVar4._12_4_ = auVar1._12_4_ + 0.0;
    auVar1._8_4_ = 0x3f000000;
    auVar1._0_8_ = 0x3f0000003f000000;
    auVar1._12_4_ = 0x3f000000;
    auVar1 = vmulps_avx512vl(auVar4,auVar1);
    local_20.z = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                  low + ctx.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    local_20._0_8_ = vmovlps_avx(auVar1);
    ImageBounds((optional<pbrt::Bounds2<float>_> *)(local_40 + 0xc),this,(Point3f *)&local_20);
    fVar3 = 0.0;
    if (local_24 != '\0') {
      if (local_40[8] == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      FVar2 = WindowedPiecewiseConstant2D::PDF
                        (&this->distribution,(Point2f *)local_40,(Bounds2f *)(local_40 + 0xc));
      fVar3 = FVar2 / local_44;
    }
  }
  return fVar3;
}

Assistant:

Float PortalImageInfiniteLight::PDF_Li(LightSampleContext ctx, Vector3f w,
                                       LightSamplingMode mode) const {
    // Find image $(u,v)$ coordinates corresponding to direction _w_
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);
    if (!uv || duv_dw == 0)
        return 0;

    // Return PDF for sampling $(u,v)$ from reference point
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float pdf = distribution.PDF(*uv, *b);
    return pdf / duv_dw;
}